

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Buffers::DefaultsTest::CheckValue<long>
          (DefaultsTest *this,long value,long reference_value,GLchar *pname_string,
          GLchar *function_string)

{
  ostringstream *this_00;
  undefined1 local_1a8 [384];
  
  if (reference_value != value) {
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,function_string);
    std::operator<<((ostream *)this_00," called with ");
    std::operator<<((ostream *)this_00,pname_string);
    std::operator<<((ostream *)this_00," parameter name returned ");
    std::ostream::_M_insert<long>((long)this_00);
    std::operator<<((ostream *)this_00,", but ");
    std::ostream::_M_insert<long>((long)this_00);
    std::operator<<((ostream *)this_00," was expected.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return reference_value == value;
}

Assistant:

bool DefaultsTest::CheckValue(const T value, const T reference_value, const glw::GLchar* pname_string,
							  const glw::GLchar* function_string)
{
	if (reference_value != value)
	{
		/* Log. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << function_string << " called with "
											<< pname_string << " parameter name returned " << value << ", but "
											<< reference_value << " was expected." << tcu::TestLog::EndMessage;

		return false;
	}
	return true;
}